

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O0

civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag> __thiscall
absl::lts_20240722::time_internal::cctz::detail::operator-
          (detail *this,civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag> a,
          diff_t n)

{
  undefined1 auVar1 [12];
  fields f;
  ulong uVar2;
  ulong uVar3;
  fields fVar4;
  int_least8_t iStack_bc;
  int_least64_t local_b8;
  undefined5 uStack_88;
  undefined3 uStack_83;
  undefined4 uStack_6c;
  int_least8_t iStack_5c;
  undefined4 uStack_34;
  diff_t n_local;
  civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag> a_local;
  
  uVar3 = a.f_._8_8_;
  a_local.f_.y = a.f_.y;
  uVar2 = std::numeric_limits<long>::min();
  if (uVar3 == uVar2) {
    fVar4 = step(this,a_local.f_.y,~uVar3);
    local_b8 = fVar4.y;
    uStack_88 = fVar4._8_5_;
    fVar4 = step(local_b8,CONCAT35(uStack_83,uStack_88),1);
    iStack_bc = fVar4.ss;
    uStack_6c = CONCAT31(uStack_6c._1_3_,iStack_bc);
    auVar1 = fVar4._0_12_;
    fVar4._12_4_ = uStack_6c;
    fVar4.y = auVar1._0_8_;
    fVar4.m = auVar1[8];
    fVar4.d = auVar1[9];
    fVar4.hh = auVar1[10];
    fVar4.mm = auVar1[0xb];
    civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag>::civil_time
              ((civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag> *)&a_local.f_.m
               ,fVar4);
  }
  else {
    fVar4 = step(this,a_local.f_.y,-uVar3);
    iStack_5c = fVar4.ss;
    uStack_34 = CONCAT31(uStack_34._1_3_,iStack_5c);
    auVar1 = fVar4._0_12_;
    f._12_4_ = uStack_34;
    f.y = auVar1._0_8_;
    f.m = auVar1[8];
    f.d = auVar1[9];
    f.hh = auVar1[10];
    f.mm = auVar1[0xb];
    civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag>::civil_time
              ((civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag> *)&a_local.f_.m
               ,f);
  }
  return (civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag>)
         stack0xffffffffffffffe8;
}

Assistant:

CONSTEXPR_F civil_time operator-(civil_time a, diff_t n) noexcept {
    return n != (std::numeric_limits<diff_t>::min)()
               ? civil_time(step(T{}, a.f_, -n))
               : civil_time(step(T{}, step(T{}, a.f_, -(n + 1)), 1));
  }